

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constructions.c
# Opt level: O1

Expr let(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,Expr *args,
        int argc)

{
  pExecutor exec_00;
  _Bool _Var1;
  ValueType VVar2;
  int iVar3;
  pContext context;
  Expr *__ptr;
  char *__s;
  anon_union_8_8_707b72ea_for_Expr_1 *paVar5;
  long lVar6;
  Expr EVar7;
  Expr EVar8;
  Expr b;
  Expr expr;
  Expr value;
  Expr a;
  Expr expr_00;
  Expr expr_01;
  Expr expr_02;
  int len;
  int var_cnt;
  int local_5c;
  int local_58;
  int local_54;
  Expr *local_50;
  Expr *local_48;
  pExecutor local_40;
  size_t local_38;
  anon_union_8_8_707b72ea_for_Expr_1 aVar4;
  
  if (argc < 2) {
    __s = "let: too few arguments";
LAB_00106bc8:
    puts(__s);
    exit(1);
  }
  EVar7._4_4_ = 0;
  EVar7.type = args->type;
  EVar7.field_1.val_atom = (args->field_1).val_atom;
  local_58 = argc;
  _Var1 = is_pair(EVar7);
  if (!_Var1) {
    a._4_4_ = 0;
    a.type = args->type;
    b._4_4_ = 0;
    b.type = (exec->nil).type;
    b.field_1.val_atom = (exec->nil).field_1.val_atom;
    a.field_1.val_atom = (args->field_1).val_atom;
    _Var1 = is_equal(a,b);
    if (!_Var1) {
      __s = "let: first argument not a list";
      goto LAB_00106bc8;
    }
  }
  expr_01._4_4_ = 0;
  expr_01.type = args->type;
  expr_01.field_1.val_atom = (args->field_1).val_atom;
  local_48 = args;
  local_50 = get_list(exec,expr_01,&local_54);
  context = context_inherit(callContext);
  if (0 < local_54) {
    paVar5 = &local_50->field_1;
    lVar6 = 0;
    local_40 = exec;
    do {
      exec_00 = local_40;
      expr_02._4_4_ = 0;
      expr_02.type = ((Expr *)(paVar5 + -1))->type;
      expr_02.field_1.val_atom = paVar5->val_atom;
      __ptr = get_list(local_40,expr_02,&local_5c);
      if ((local_5c == 0) || (2 < local_5c)) {
LAB_00106bb8:
        __s = "let: invalid initializer";
        goto LAB_00106bc8;
      }
      expr_00._4_4_ = 0;
      expr_00.type = __ptr->type;
      expr_00.field_1.val_atom = (__ptr->field_1).val_atom;
      _Var1 = is_atom(expr_00);
      if (!_Var1) goto LAB_00106bb8;
      local_38 = (__ptr->field_1).val_atom;
      if (local_5c == 1) {
        VVar2 = (exec_00->nil).type;
        aVar4 = (anon_union_8_8_707b72ea_for_Expr_1)(exec_00->nil).field_1.val_atom;
      }
      else {
        expr._4_4_ = 0;
        expr.type = __ptr[1].type;
        expr.field_1.val_atom = __ptr[1].field_1.val_atom;
        EVar7 = exec_eval(exec_00,context,expr);
        aVar4 = EVar7.field_1;
        VVar2 = EVar7.type;
      }
      free(__ptr);
      value._4_4_ = 0;
      value.type = VVar2;
      value.field_1.val_atom = aVar4.val_atom;
      iVar3 = context_bind(context,local_38,value);
      if (iVar3 == -1) {
        __s = "let context_bind failed";
        goto LAB_00106bc8;
      }
      lVar6 = lVar6 + 1;
      paVar5 = paVar5 + 2;
      exec = local_40;
    } while (lVar6 < local_54);
  }
  free(local_50);
  EVar7 = exec_eval_array(exec,context,local_48 + 1,local_58 + -1);
  EVar8.field_1 = EVar7.field_1;
  EVar8.type = EVar7.type;
  context_unlink(context);
  EVar8._4_4_ = 0;
  return EVar8;
}

Assistant:

BUILTIN_FUNC(let)
{
    if (argc < 2)
    {
        log("let: too few arguments");
        exit(1);
    }
    if (!is_pair(args[0]) && !is_equal(args[0], exec->nil))
    {
        log("let: first argument not a list");
        exit(1);
    }
    int var_cnt;
    Expr *var_list = get_list(exec, args[0], &var_cnt);

    pContext context = context_inherit(callContext);
    for (int i = 0; i < var_cnt; i++)
    {
        int len;
        Expr *list = get_list(exec, var_list[i], &len);
        if (len == 0 || len > 2 || !is_atom(list[0]))
        {
            log("let: invalid initializer");
            exit(1);
        }
        Expr name = list[0];
        Expr value;
        if (len == 1)
            value = exec->nil;
        else
            value = exec_eval(exec, context, list[1]);
        free(list);
        if (context_bind(context, name.val_atom, value) == MAP_FAILED)
        {
            log("let context_bind failed");
            exit(1);
        }
    }
    free(var_list);

    Expr res = exec_eval_array(exec, context, args + 1, argc - 1);
    context_unlink(context);

    return res;
}